

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::productQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *row,HighsInt debug_report)

{
  bool bVar1;
  reference this_00;
  const_reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  HighsSparseMatrix *in_RDI;
  double dVar5;
  HighsInt iEl_1;
  HighsCDouble value_1;
  HighsInt iRow_1;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> value;
  size_type in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *this_01;
  value_type *in_stack_ffffffffffffff20;
  HighsCDouble *this_02;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar6;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffff30;
  int local_8c;
  HighsCDouble local_88;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  HighsCDouble local_50;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_40;
  undefined8 local_28;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_28 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(value_type_conflict1 *)0x7eba98);
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    HighsCDouble::HighsCDouble(&local_50,0.0);
    std::allocator<HighsCDouble>::allocator((allocator<HighsCDouble> *)0x7ebae0);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::allocator<HighsCDouble>::~allocator((allocator<HighsCDouble> *)0x7ebb0b);
    for (local_68 = 0; local_68 < in_RDI->num_col_; local_68 = local_68 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_68);
      for (local_6c = *pvVar2; iVar6 = local_6c,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_68 + 1)), iVar6 < *pvVar2;
          local_6c = local_6c + 1) {
        std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_68);
        std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->value_,(long)local_6c);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_6c);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&local_40,(long)*pvVar2);
        HighsCDouble::operator+=(in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
      }
    }
    for (local_70 = 0; local_70 < in_RDI->num_row_; local_70 = local_70 + 1) {
      this_00 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                          (&local_40,(long)local_70);
      dVar5 = HighsCDouble::operator_cast_to_double(this_00);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_70);
      *pvVar4 = dVar5;
    }
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_ffffffffffffff20);
  }
  else {
    for (local_74 = 0; local_74 < in_RDI->num_row_; local_74 = local_74 + 1) {
      HighsCDouble::HighsCDouble(&local_88,0.0);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_74);
      local_8c = *pvVar2;
      while (iVar6 = local_8c,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_74 + 1)), iVar6 < *pvVar2) {
        this_01 = local_18;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_8c);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)*pvVar2);
        this_02 = (HighsCDouble *)*pvVar3;
        std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->value_,(long)local_8c);
        HighsCDouble::operator+=(this_02,(double)this_01);
        local_8c = local_8c + 1;
      }
      dVar5 = HighsCDouble::operator_cast_to_double(&local_88);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_74);
      *pvVar4 = dVar5;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productQuad(vector<double>& result,
                                    const vector<double>& row,
                                    const HighsInt debug_report) const {
  assert(this->formatOk());
  assert((int)row.size() >= this->num_col_);
  result.assign(this->num_row_, 0.0);
  if (this->isColwise()) {
    std::vector<HighsCDouble> value(this->num_row_, 0);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value[this->index_[iEl]] += row[iCol] * this->value_[iEl];
    }
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++)
      result[iRow] = double(value[iRow]);
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        value += row[this->index_[iEl]] * this->value_[iEl];
      result[iRow] = double(value);
    }
  }
}